

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collect.h
# Opt level: O0

AT * async_simple::coro::detail::
     collectAllImpl<false,std::vector<async_simple::coro::Lazy<void>,std::allocator<async_simple::coro::Lazy<void>>>,void,std::allocator<async_simple::Try<void>>>
               (allocator<async_simple::Try<void>_> *param_1,undefined8 param_2,
               allocator<async_simple::Try<void>_> *param_3)

{
  allocator<async_simple::Try<void>_> *paVar1;
  allocator<async_simple::Try<void>_> local_19;
  allocator<async_simple::Try<void>_> *local_18;
  undefined8 local_10;
  allocator<async_simple::Try<void>_> *local_8;
  
  paVar1 = param_1;
  local_18 = param_3;
  local_10 = param_2;
  local_8 = param_1;
  std::allocator<async_simple::Try<void>_>::allocator(param_1,param_3);
  SimpleCollectAllAwaitable<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
  ::SimpleCollectAllAwaitable
            ((SimpleCollectAllAwaitable<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
              *)param_1,param_2,&local_19);
  std::allocator<async_simple::Try<void>_>::~allocator(&local_19);
  return (AT *)paVar1;
}

Assistant:

inline auto collectAllImpl(Container input, OAlloc out_alloc = OAlloc()) {
    using LazyType = typename Container::value_type;
    using AT = std::conditional_t<
        is_lazy<LazyType>::value,
        detail::SimpleCollectAllAwaitable<Container, OAlloc, Para>,
        detail::CollectAllAwaiter<Container, OAlloc, Para>>;
    return AT(std::move(input), out_alloc);
}